

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status fdb_init(fdb_config *config)

{
  sb_ops ops;
  bool bVar1;
  int64_t iVar2;
  uint uVar3;
  fdb_status fVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  fdb_seqtree_opt_t local_152;
  byte local_151;
  size_t local_150;
  uint64_t local_148;
  compactor_config local_140;
  filemgr_config f_config;
  size_t local_b0;
  byte local_a8;
  undefined1 local_3c;
  uint32_t local_38;
  
  if (config == (fdb_config *)0x0) {
    get_default_config();
    local_152 = (fdb_seqtree_opt_t)f_config.num_wal_shards;
    local_148._0_1_ = f_config.encryption_key.bytes[0x10];
    local_148._1_1_ = f_config.encryption_key.bytes[0x11];
    local_148._2_1_ = f_config.encryption_key.bytes[0x12];
    local_148._3_1_ = f_config.encryption_key.bytes[0x13];
    local_148._4_1_ = f_config.encryption_key.bytes[0x14];
    local_148._5_1_ = f_config.encryption_key.bytes[0x15];
    local_148._6_1_ = f_config.encryption_key.bytes[0x16];
    local_148._7_1_ = f_config.encryption_key.bytes[0x17];
    local_150 = local_b0;
    local_151 = local_a8;
    uVar5 = f_config._8_8_;
    uVar3 = f_config.ncacheblock;
  }
  else {
    bVar1 = validate_fdb_config(config);
    if (!bVar1) {
      return FDB_RESULT_INVALID_CONFIG;
    }
    local_152 = config->seqtree_opt;
    local_148 = config->compactor_sleep_duration;
    local_150 = config->num_compactor_threads;
    local_151 = config->enable_background_compactor;
    local_3c = config->do_not_cache_doc_blocks;
    local_38 = config->num_blocks_readahead;
    uVar5 = config->buffercache_size;
    uVar3 = config->blocksize;
  }
  pthread_spin_lock(&initial_lock);
  fVar4 = FDB_RESULT_SUCCESS;
  if (fdb_initialized.super___atomic_base<unsigned_char>._M_i == '\0') {
    iVar2 = get_memory_size();
    auVar6._8_4_ = (int)(uVar5 >> 0x20);
    auVar6._0_8_ = uVar5;
    auVar6._12_4_ = 0x45300000;
    if ((double)iVar2 * 0.8 <
        (auVar6._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) {
      fVar4 = FDB_RESULT_TOO_BIG_BUFFER_CACHE;
    }
    else {
      fdb_log_init((fdb_log_config)config->log_msg_level);
      fVar4 = FDB_RESULT_SUCCESS;
      f_config.ncacheblock = (int)(uVar5 / uVar3);
      f_config.seqtree_opt = local_152;
      f_config.blocksize = uVar3;
      f_config.do_not_cache_doc_blocks = (bool)local_3c;
      f_config.num_blocks_readahead = local_38;
      filemgr_init(&f_config);
      filemgr_set_lazy_file_deletion
                ((bool)(local_151 & 1),compactor_register_file_removing,compactor_is_file_removed);
      bVar1 = ver_superblock_support(0xdeadcafebeefc002);
      if (bVar1) {
        ops.get_default_config = sb_get_default_config;
        ops.init = sb_init;
        ops.read_latest = sb_read_latest;
        ops.alloc_block = sb_alloc_block;
        ops.is_writable = sb_bmp_is_writable;
        ops.get_bmp_revnum = sb_get_bmp_revnum;
        ops.get_min_live_revnum = sb_get_min_live_revnum;
        ops.release = sb_free;
        filemgr_set_sb_operation(ops);
        sb_bmp_mask_init();
      }
      local_140.sleep_duration = local_148;
      local_140.num_threads = local_150;
      local_140.spawn_threads = (bool)local_151;
      compactor_init(&local_140);
      LOCK();
      fdb_initialized.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)'\x01'
      ;
      UNLOCK();
    }
  }
  pthread_spin_unlock(&initial_lock);
  return fVar4;
}

Assistant:

LIBFDB_API
fdb_status fdb_init(fdb_config *config)
{
    fdb_config _config;
    struct filemgr_config f_config;

    if (config) {
        if (validate_fdb_config(config)) {
            _config = *config;
        } else {
            return FDB_RESULT_INVALID_CONFIG;
        }
    } else {
        _config = get_default_config();
    }

    // global initialization
    // initialized only once at first time
    if (!fdb_initialized) {

#ifndef SPIN_INITIALIZER
        init_initial_lock_status();
#endif

    }
    spin_lock(&initial_lock);
    if (!fdb_initialized) {
#if !defined(_ANDROID_) && !defined(__ANDROID__)
        // Some Android devices (e.g., Nexus 6) return incorrect RAM size.
        // We temporarily disable validity checking of block cache size
        // on Android platform at this time.
        double ram_size = (double) get_memory_size();
        if (ram_size * BCACHE_MEMORY_THRESHOLD < (double) _config.buffercache_size) {
            spin_unlock(&initial_lock);
            return FDB_RESULT_TOO_BIG_BUFFER_CACHE;
        }
#endif
        // Initialize log message routine.
        struct fdb_log_config _log_config;
        _log_config.log_msg_level = config->log_msg_level;
        fdb_log_init(_log_config);

        // initialize file manager and block cache
        f_config.blocksize = _config.blocksize;
        f_config.ncacheblock = _config.buffercache_size / _config.blocksize;
        f_config.seqtree_opt = _config.seqtree_opt;
        f_config.do_not_cache_doc_blocks = _config.do_not_cache_doc_blocks;
        f_config.num_blocks_readahead = _config.num_blocks_readahead;
        filemgr_init(&f_config);

        // WARNING: If background compactor is disabled,
        //          we should disable lazy deletion as well,
        //          since there will be no thread to do deletion.
        filemgr_set_lazy_file_deletion(_config.enable_background_compactor,
                                       compactor_register_file_removing,
                                       compactor_is_file_removed);
        if (ver_superblock_support(ver_get_latest_magic())) {
            struct sb_ops sb_ops = {sb_init, sb_get_default_config,
                                    sb_read_latest, sb_alloc_block,
                                    sb_bmp_is_writable, sb_get_bmp_revnum,
                                    sb_get_min_live_revnum, sb_free};
            filemgr_set_sb_operation(sb_ops);
            sb_bmp_mask_init();
        }

        // initialize compaction daemon
        compactor_config c_config;
        c_config = _config;
        compactor_init(&c_config);

        // initialize background flusher daemon
        // Temporarily disable background flushers until blockcache contention
        // issue is resolved.
        //bgf_config.num_threads = 0; //_config.num_bgflusher_threads;
        //bgflusher_init(&bgf_config);

        // Initialize breakpad
        //_dbg_handle_crashes(config->breakpad_minidump_dir);

        fdb_initialized = 1;
    }
    spin_unlock(&initial_lock);

    return FDB_RESULT_SUCCESS;
}